

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int __thiscall cmCTest::ReadCustomConfigurationFileTree(cmCTest *this,char *dir,cmMakefile *mf)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  ostream *poVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  _Rb_tree_node_base *p_Var7;
  pointer pbVar8;
  Glob gl;
  string fname;
  string rexpr;
  VectorOfStrings ndirs;
  VectorOfStrings dirs;
  ostringstream cmCTestLog_msg;
  undefined1 auStack_2b8 [8];
  cmCTest *local_2b0;
  undefined1 local_2a8 [88];
  cmMakefile *local_250;
  long *local_248;
  long local_238 [2];
  long *local_228;
  long local_220;
  long local_218 [2];
  string local_208;
  vector<cmsys::String,_std::allocator<cmsys::String>_> local_1e8;
  vector<cmsys::String,_std::allocator<cmsys::String>_> local_1c8;
  undefined1 local_1a8 [376];
  
  local_1c8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b0 = this;
  local_250 = mf;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"* Read custom CTest configuration directory: ",0x2d);
  if (dir == (char *)0x0) {
    std::ios::clear((int)(auStack_2b8 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18)) + 0x110);
  }
  else {
    sVar4 = strlen(dir);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,dir,sVar4);
  }
  std::ios::widen((char)(ostream *)local_1a8 + (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_2b0,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x8ed,(char *)local_2a8._0_8_,false);
  if ((GlobInternals *)local_2a8._0_8_ != (GlobInternals *)(local_2a8 + 0x10)) {
    operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::string::string((string *)&local_228,dir,(allocator *)local_1a8);
  std::__cxx11::string::append((char *)&local_228);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"* Check for file: ",0x12)
  ;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_228,local_220);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_2b0,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x8f1,(char *)local_2a8._0_8_,false);
  if ((GlobInternals *)local_2a8._0_8_ != (GlobInternals *)(local_2a8 + 0x10)) {
    operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  bVar2 = cmsys::SystemTools::FileExists((char *)local_228);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_00287b60;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"* Read custom CTest configuration file: ",0x28);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_228,local_220);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_2b0,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x8f4,(char *)local_2a8._0_8_,false);
  if ((GlobInternals *)local_2a8._0_8_ != (GlobInternals *)(local_2a8 + 0x10)) {
    operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  bVar3 = true;
  if ((cmSystemTools::s_ErrorOccured == false) && (cmSystemTools::s_FatalErrorOccured == false)) {
    bVar3 = cmSystemTools::GetInterruptFlag();
  }
  cmSystemTools::s_FatalErrorOccured = false;
  cmSystemTools::s_ErrorOccured = false;
  bVar2 = cmMakefile::ReadListFile(local_250,(char *)local_228);
  if (((bVar2) && (cmSystemTools::s_ErrorOccured == false)) &&
     (cmSystemTools::s_FatalErrorOccured == false)) {
    bVar2 = cmSystemTools::GetInterruptFlag();
    if (bVar2) goto LAB_00287a71;
  }
  else {
LAB_00287a71:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Problem reading custom configuration: ",0x26);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_228,local_220);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_2b0,6,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x8fb,(char *)local_2a8._0_8_,false);
    if ((GlobInternals *)local_2a8._0_8_ != (GlobInternals *)(local_2a8 + 0x10)) {
      operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  bVar2 = true;
  if (bVar3 != false) {
    cmSystemTools::s_ErrorOccured = true;
  }
LAB_00287b60:
  std::__cxx11::string::string((string *)&local_208,dir,(allocator *)local_1a8);
  std::__cxx11::string::append((char *)&local_208);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"* Check for file: ",0x12)
  ;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_2b0,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x905,(char *)local_2a8._0_8_,false);
  if ((GlobInternals *)local_2a8._0_8_ != (GlobInternals *)(local_2a8 + 0x10)) {
    operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  if (!bVar2) {
    bVar3 = cmsys::SystemTools::FileExists(local_208._M_dataplus._M_p);
    if (bVar3) {
      cmsys::Glob::Glob((Glob *)local_2a8);
      local_2a8[8] = true;
      cmsys::Glob::FindFiles((Glob *)local_2a8,&local_208,(GlobMessages *)0x0);
      pvVar6 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_2a8);
      pbVar8 = (pvVar6->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pbVar8 != (pvVar6->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"* Read custom CTest configuration file: ",0x28);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(pbVar8->_M_dataplus)._M_p,
                              pbVar8->_M_string_length);
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          Log(local_2b0,0,
              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
              ,0x90e,(char *)local_248,false);
          if (local_248 != local_238) {
            operator_delete(local_248,local_238[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          bVar2 = cmMakefile::ReadListFile(local_250,(pbVar8->_M_dataplus)._M_p);
          if (((bVar2) && (cmSystemTools::s_ErrorOccured == false)) &&
             (cmSystemTools::s_FatalErrorOccured == false)) {
            bVar2 = cmSystemTools::GetInterruptFlag();
            if (bVar2) goto LAB_00287dcd;
          }
          else {
LAB_00287dcd:
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Problem reading custom configuration: ",0x26);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(pbVar8->_M_dataplus)._M_p,
                                pbVar8->_M_string_length);
            std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            std::__cxx11::stringbuf::str();
            Log(local_2b0,6,
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
                ,0x913,(char *)local_248,false);
            if (local_248 != local_238) {
              operator_delete(local_248,local_238[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          }
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 != (pvVar6->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
      }
      cmsys::Glob::~Glob((Glob *)local_2a8);
      bVar2 = true;
    }
  }
  if (bVar2) {
    p_Var7 = (local_2b0->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(local_2b0->TestingHandlers)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 != p_Var1) {
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"* Read custom CTest configuration vectors for handler: ",
                   0x37);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,*(char **)(p_Var7 + 1),(long)p_Var7[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
        poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(local_2b0,0,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x91f,(char *)local_2a8._0_8_,false);
        if ((GlobInternals *)local_2a8._0_8_ != (GlobInternals *)(local_2a8 + 0x10)) {
          operator_delete((void *)local_2a8._0_8_,(ulong)(local_2a8._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        (**(code **)**(undefined8 **)(p_Var7 + 2))(*(undefined8 **)(p_Var7 + 2),local_250);
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != p_Var1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&local_1e8);
  std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&local_1c8);
  return 1;
}

Assistant:

int cmCTest::ReadCustomConfigurationFileTree(const char* dir, cmMakefile* mf)
{
  bool found = false;
  VectorOfStrings dirs;
  VectorOfStrings ndirs;
  cmCTestLog(this, DEBUG, "* Read custom CTest configuration directory: "
               << dir << std::endl);

  std::string fname = dir;
  fname += "/CTestCustom.cmake";
  cmCTestLog(this, DEBUG, "* Check for file: " << fname << std::endl);
  if (cmSystemTools::FileExists(fname.c_str())) {
    cmCTestLog(this, DEBUG, "* Read custom CTest configuration file: "
                 << fname << std::endl);
    bool erroroc = cmSystemTools::GetErrorOccuredFlag();
    cmSystemTools::ResetErrorOccuredFlag();

    if (!mf->ReadListFile(fname.c_str()) ||
        cmSystemTools::GetErrorOccuredFlag()) {
      cmCTestLog(this, ERROR_MESSAGE, "Problem reading custom configuration: "
                   << fname << std::endl);
    }
    found = true;
    if (erroroc) {
      cmSystemTools::SetErrorOccured();
    }
  }

  std::string rexpr = dir;
  rexpr += "/CTestCustom.ctest";
  cmCTestLog(this, DEBUG, "* Check for file: " << rexpr << std::endl);
  if (!found && cmSystemTools::FileExists(rexpr.c_str())) {
    cmsys::Glob gl;
    gl.RecurseOn();
    gl.FindFiles(rexpr);
    std::vector<std::string>& files = gl.GetFiles();
    std::vector<std::string>::iterator fileIt;
    for (fileIt = files.begin(); fileIt != files.end(); ++fileIt) {
      cmCTestLog(this, DEBUG, "* Read custom CTest configuration file: "
                   << *fileIt << std::endl);
      if (!mf->ReadListFile(fileIt->c_str()) ||
          cmSystemTools::GetErrorOccuredFlag()) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Problem reading custom configuration: " << *fileIt
                                                            << std::endl);
      }
    }
    found = true;
  }

  if (found) {
    cmCTest::t_TestingHandlers::iterator it;
    for (it = this->TestingHandlers.begin(); it != this->TestingHandlers.end();
         ++it) {
      cmCTestLog(this, DEBUG,
                 "* Read custom CTest configuration vectors for handler: "
                   << it->first << " (" << it->second << ")" << std::endl);
      it->second->PopulateCustomVectors(mf);
    }
  }

  return 1;
}